

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# each.cpp
# Opt level: O3

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_13(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> r;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_dc;
  undefined4 local_d8;
  int local_d4;
  Result local_d0;
  undefined4 *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  local_d8 = 0xb;
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/get.cpp"
             ,0x39,"r == 11","",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_dc,DT_CHECK);
  local_b0 = &local_d8;
  local_a8 = local_dc.m_at;
  local_d4 = 0xb;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_d0,(Expression_lhs<int_const&> *)&local_b0,&local_d4);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  return;
}

Assistant:

dummy ()
        {
            ++instances_count;
        }